

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Matrix<float,_3,_4> * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::matrixCompMult<float,3,4>
          (Matrix<float,_3,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Matrix<float,_3,_4> *a,
          Matrix<float,_3,_4> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_2c;
  undefined4 local_28;
  int c;
  int r;
  Matrix<float,_3,_4> *b_local;
  Matrix<float,_3,_4> *a_local;
  Matrix<float,_3,_4> *retVal;
  
  tcu::Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      pfVar3 = tcu::Matrix<float,_3,_4>::operator()((Matrix<float,_3,_4> *)this,local_28,local_2c);
      fVar1 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_3,_4>::operator()(a,local_28,local_2c);
      fVar2 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_3,_4>::operator()(__return_storage_ptr__,local_28,local_2c);
      *pfVar3 = fVar1 * fVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}